

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.cpp
# Opt level: O3

int64_t npas4::GetRAMPhysicalAvailable(void)

{
  long lVar1;
  sysinfo memInfo;
  sysinfo local_80;
  
  sysinfo(&local_80);
  lVar1 = local_80.mem_unit * local_80.totalram;
  sysinfo(&local_80);
  return (ulong)local_80.mem_unit * (local_80.freeram - local_80.totalram) + lVar1;
}

Assistant:

int64_t npas4::GetRAMPhysicalAvailable()
{
#ifdef WIN32
	MEMORYSTATUSEX memInfo;
	memInfo.dwLength = sizeof(MEMORYSTATUSEX);
	GlobalMemoryStatusEx(&memInfo);
	return static_cast<int64_t>(memInfo.ullAvailPhys);
#else
	return npas4::GetRAMPhysicalTotal() - npas4::GetRAMPhysicalUsed();
#endif
}